

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O1

ALCenum __thiscall
anon_unknown.dwarf_259da0::AlsaCapture::captureSamples
          (AlsaCapture *this,byte *buffer,ALCuint samples)

{
  RingBuffer *this_00;
  pointer pbVar1;
  pointer pbVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  undefined8 uVar7;
  size_t in_RCX;
  size_t __n;
  long __n2;
  pointer pbVar8;
  bool bVar9;
  
  this_00 = (this->mRing)._M_t.super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>.
            _M_t.super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
            super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl;
  if (this_00 == (RingBuffer *)0x0) {
    this->mLastAvail = this->mLastAvail - (long)(ulong)samples;
    do {
      if ((((((this->super_BackendBase).mDevice)->Connected)._M_base._M_i & 1U) == 0) ||
         (samples == 0)) break;
      pbVar1 = (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
               super__Vector_impl_data._M_start;
      pbVar8 = (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pbVar1 == pbVar8) {
        if (this->mDoCapture == true) {
          uVar6 = (*(anonymous_namespace)::psnd_pcm_readi)(this->mPcmHandle,buffer,samples);
        }
        else {
          uVar6 = 0;
        }
      }
      else {
        uVar4 = (*(anonymous_namespace)::psnd_pcm_bytes_to_frames)
                          (this->mPcmHandle,(long)pbVar8 - (long)pbVar1);
        uVar6 = (ulong)samples;
        if (uVar4 < samples) {
          uVar6 = uVar4;
        }
        sVar5 = (*(anonymous_namespace)::psnd_pcm_frames_to_bytes)(this->mPcmHandle,uVar6);
        if (0 < (long)sVar5) {
          memmove(buffer,(this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>
                         ._M_impl.super__Vector_impl_data._M_start,sVar5);
        }
        if (sVar5 != 0) {
          pbVar1 = (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pbVar8 = pbVar1 + sVar5;
          __n = (long)(this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pbVar8;
          if (__n != 0) {
            memmove(pbVar1,pbVar8,__n);
          }
          pbVar2 = (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          if (pbVar2 != pbVar1 + ((long)pbVar2 - (long)pbVar8)) {
            (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
            super__Vector_impl_data._M_finish = pbVar1 + ((long)pbVar2 - (long)pbVar8);
          }
        }
        uVar6 = (*(anonymous_namespace)::psnd_pcm_bytes_to_frames)(this->mPcmHandle,sVar5);
      }
      if ((long)uVar6 < 0) {
        if (0 < (int)gLogLevel) {
          _GLOBAL__N_1::AlsaCapture::captureSamples();
        }
        if (uVar6 == 0xfffffffffffffff5) goto LAB_0016415c;
        iVar3 = (*(anonymous_namespace)::psnd_pcm_recover)(this->mPcmHandle,uVar6 & 0xffffffff,1);
        if ((iVar3 < 0) ||
           (iVar3 = (*(anonymous_namespace)::psnd_pcm_start)(this->mPcmHandle), iVar3 < 0)) {
          uVar6 = (ulong)iVar3;
        }
        else {
          uVar6 = (*(anonymous_namespace)::psnd_pcm_avail_update)(this->mPcmHandle);
        }
        if ((long)uVar6 < 0) {
          uVar7 = (*(anonymous_namespace)::psnd_strerror)(uVar6 & 0xffffffff);
          if (0 < (int)gLogLevel) {
            fprintf((FILE *)gLogFile,"[ALSOFT] (EE) restore error: %s\n",uVar7);
          }
          ALCdevice::handleDisconnect
                    ((this->super_BackendBase).mDevice,"Capture recovery failure: %s",uVar7);
          bVar9 = true;
        }
        else {
          bVar9 = uVar6 < samples;
        }
      }
      else {
        buffer = buffer + uVar6;
        samples = samples - (int)uVar6;
LAB_0016415c:
        bVar9 = false;
      }
    } while (!bVar9);
    if ((samples != 0) &&
       (sVar5 = (*(anonymous_namespace)::psnd_pcm_frames_to_bytes)(this->mPcmHandle,samples),
       0 < (long)sVar5)) {
      memset(buffer,(uint)(((this->super_BackendBase).mDevice)->FmtType != DevFmtUByte) * 0x80 +
                    -0x80,sVar5);
    }
  }
  else {
    RingBuffer::read(this_00,(int)buffer,(void *)(ulong)samples,in_RCX);
  }
  return 0;
}

Assistant:

ALCenum AlsaCapture::captureSamples(al::byte *buffer, ALCuint samples)
{
    if(mRing)
    {
        mRing->read(buffer, samples);
        return ALC_NO_ERROR;
    }

    mLastAvail -= samples;
    while(mDevice->Connected.load(std::memory_order_acquire) && samples > 0)
    {
        snd_pcm_sframes_t amt{0};

        if(!mBuffer.empty())
        {
            /* First get any data stored from the last stop */
            amt = snd_pcm_bytes_to_frames(mPcmHandle, static_cast<ssize_t>(mBuffer.size()));
            if(static_cast<snd_pcm_uframes_t>(amt) > samples) amt = samples;

            amt = snd_pcm_frames_to_bytes(mPcmHandle, amt);
            std::copy_n(mBuffer.begin(), amt, buffer);

            mBuffer.erase(mBuffer.begin(), mBuffer.begin()+amt);
            amt = snd_pcm_bytes_to_frames(mPcmHandle, amt);
        }
        else if(mDoCapture)
            amt = snd_pcm_readi(mPcmHandle, buffer, samples);
        if(amt < 0)
        {
            ERR("read error: %s\n", snd_strerror(static_cast<int>(amt)));

            if(amt == -EAGAIN)
                continue;
            if((amt=snd_pcm_recover(mPcmHandle, static_cast<int>(amt), 1)) >= 0)
            {
                amt = snd_pcm_start(mPcmHandle);
                if(amt >= 0)
                    amt = snd_pcm_avail_update(mPcmHandle);
            }
            if(amt < 0)
            {
                const char *err{snd_strerror(static_cast<int>(amt))};
                ERR("restore error: %s\n", err);
                mDevice->handleDisconnect("Capture recovery failure: %s", err);
                break;
            }
            /* If the amount available is less than what's asked, we lost it
             * during recovery. So just give silence instead. */
            if(static_cast<snd_pcm_uframes_t>(amt) < samples)
                break;
            continue;
        }

        buffer = buffer + amt;
        samples -= static_cast<ALCuint>(amt);
    }
    if(samples > 0)
        std::fill_n(buffer, snd_pcm_frames_to_bytes(mPcmHandle, samples),
            al::byte((mDevice->FmtType == DevFmtUByte) ? 0x80 : 0));

    return ALC_NO_ERROR;
}